

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,uint w,uint h,
                    State *state)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  size_t sVar4;
  uchar *in_00;
  
  sVar4 = lodepng_get_raw_size(w,h,&(state->super_LodePNGState).info_raw);
  puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)puVar1 - (long)puVar2) < sVar4) {
    return 0x54;
  }
  in_00 = (uchar *)0x0;
  if (puVar2 != puVar1) {
    in_00 = puVar2;
  }
  uVar3 = encode(out,in_00,w,h,state);
  return uVar3;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
                const std::vector<unsigned char>& in, unsigned w, unsigned h,
                State& state)
{
  if(lodepng_get_raw_size(w, h, &state.info_raw) > in.size()) return 84;
  return encode(out, in.empty() ? 0 : &in[0], w, h, state);
}